

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.h
# Opt level: O3

_Bool hex_encode(void *buf,size_t bufsize,char *dest,size_t destsize)

{
  long lVar1;
  size_t sVar2;
  byte bVar3;
  char cVar4;
  
  if (bufsize * 2 < destsize) {
    if (bufsize != 0) {
      lVar1 = 0;
      sVar2 = 0;
      do {
        bVar3 = *(byte *)((long)buf + sVar2);
        cVar4 = (bVar3 >> 4) + 0x57;
        if (bVar3 < 0xa0) {
          cVar4 = (bVar3 >> 4) + 0x30;
        }
        dest[sVar2 * 2] = cVar4;
        bVar3 = bVar3 & 0xf;
        cVar4 = bVar3 + 0x57;
        if (bVar3 < 10) {
          cVar4 = bVar3 + 0x30;
        }
        dest[sVar2 * 2 + 1] = cVar4;
        sVar2 = sVar2 + 1;
        lVar1 = lVar1 + -2;
      } while (bufsize != sVar2);
      dest = dest + -lVar1;
    }
    *dest = '\0';
  }
  return bufsize * 2 < destsize;
}

Assistant:

static inline size_t hex_str_size(size_t bytes)
{
	return 2 * bytes + 1;
}